

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::Plotter(Plotter *this,bool use_latex)

{
  _Rb_tree_header *p_Var1;
  Environment *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  uint64_t uVar4;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->use_latex = use_latex;
  (this->view).swid = 0;
  (this->view).shigh = 0;
  (this->view).xmax = 0.0;
  (this->view).xmin = 0.0;
  (this->view).ymax = 0.0;
  (this->view).ymin = 0.0;
  this->curr_func = 0;
  (this->view).swid = 1000;
  (this->view).shigh = 600;
  this->enable_axes = true;
  this->enable_grid = true;
  this->polar_grid = false;
  (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &(this->func_error).field_2;
  (this->func_error)._M_dataplus._M_p = (pointer)local_38;
  (this->func_error)._M_string_length = 0;
  (this->func_error).field_2._M_local_buf[0] = '\0';
  (this->sliders).super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sliders).super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sliders).super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->sliders_vars)._M_t._M_impl.super__Rb_tree_header;
  (this->sliders_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sliders_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sliders_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sliders_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sliders_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = &(this->slider_error).field_2;
  (this->slider_error)._M_dataplus._M_p = (pointer)local_40;
  (this->slider_error)._M_string_length = 0;
  (this->slider_error).field_2._M_local_buf[0] = '\0';
  this->focus_on_editor = true;
  this->require_update = false;
  (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->marker_text)._M_dataplus._M_p = (pointer)&(this->marker_text).field_2;
  (this->marker_text)._M_string_length = 0;
  (this->marker_text).field_2._M_local_buf[0] = '\0';
  this->marker_clickable_radius = 8;
  this->passive_marker_click_behavior = PASSIVE_MARKER_CLICK_DRAG_TRACE;
  this->max_functions_find_all_crit_points = 5;
  this->max_functions_find_crit_points = 0x32;
  this_00 = &this->env;
  Environment::Environment(this_00);
  (this->draw_buf).
  super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->draw_buf).
  super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->draw_buf).
  super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  (this->bg_bitmap)._M_dataplus._M_p = (pointer)&(this->bg_bitmap).field_2;
  (this->bg_bitmap)._M_string_length = 0;
  (this->bg_bitmap).field_2._M_local_buf[0] = '\0';
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->reuse_colors).
  super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->pt_markers).super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pt_markers).super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pt_markers).super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->loss_detail = false;
  std::_Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>::_M_initialize_map
            (&(this->reuse_colors).
              super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>,0);
  this->last_expr_color = 0;
  (this->slider_animation_prev_time).__d.__r = 0;
  this->next_func_name = 0;
  dVar3 = (((double)(this->view).swid * 10.0) / (double)(this->view).shigh) * 0.6;
  (this->view).xmax = dVar3;
  (this->view).xmin = -dVar3;
  (this->view).ymax = 6.0;
  (this->view).ymin = -6.0;
  this->require_update = true;
  set_curr_func(this,((long)(this->funcs).
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->funcs).
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5);
  this->drag_view = false;
  this->drag_trace = false;
  this->drag_marker = -1;
  paVar2 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"x","");
  uVar4 = Environment::addr_of(this_00,&local_60,false);
  this->x_var = (uint32_t)uVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"y","");
  uVar4 = Environment::addr_of(this_00,&local_60,false);
  this->y_var = (uint32_t)uVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"t","");
  uVar4 = Environment::addr_of(this_00,&local_60,false);
  this->t_var = (uint32_t)uVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"r","");
  uVar4 = Environment::addr_of(this_00,&local_60,false);
  this->r_var = (uint32_t)uVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Plotter::Plotter(bool use_latex)
    : view{SCREEN_WIDTH, SCREEN_HEIGHT, 0., 0., 0., 0.}, use_latex(use_latex)
{
    reset_view();
    add_func();
    drag_trace = drag_view = false;
    drag_marker = -1;

    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);
    r_var = env.addr_of("r", false);
}